

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Number.h
# Opt level: O1

void __thiscall Num::~Num(Num *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Token_001258b0;
  pcVar2 = (this->super_Token).Literal._M_dataplus._M_p;
  paVar1 = &(this->super_Token).Literal.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

~Num(){}